

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbcEncrypt.c
# Opt level: O2

void cbc512Encrypt(ThreefishKey_t *key,uint64_t *iv,uint64_t *plain_text,uint64_t num_blocks)

{
  uint64_t block;
  ulong uVar1;
  
  *plain_text = *plain_text ^ *iv;
  plain_text[1] = plain_text[1] ^ iv[1];
  plain_text[2] = plain_text[2] ^ iv[2];
  plain_text[3] = plain_text[3] ^ iv[3];
  plain_text[4] = plain_text[4] ^ iv[4];
  plain_text[5] = plain_text[5] ^ iv[5];
  plain_text[6] = plain_text[6] ^ iv[6];
  plain_text[7] = plain_text[7] ^ iv[7];
  for (uVar1 = 0; uVar1 < num_blocks << 3; uVar1 = uVar1 + 8) {
    if (uVar1 != 0) {
      *(uint *)plain_text = (uint)plain_text[-8] ^ (uint)*plain_text;
      *(uint *)((long)plain_text + 4) =
           *(uint *)((long)plain_text + -0x3c) ^ *(uint *)((long)plain_text + 4);
      *(uint *)(plain_text + 1) = (uint)plain_text[-7] ^ (uint)plain_text[1];
      *(uint *)((long)plain_text + 0xc) =
           *(uint *)((long)plain_text + -0x34) ^ *(uint *)((long)plain_text + 0xc);
      *(uint *)(plain_text + 2) = (uint)plain_text[2] ^ (uint)plain_text[-6];
      *(uint *)((long)plain_text + 0x14) =
           *(uint *)((long)plain_text + 0x14) ^ *(uint *)((long)plain_text + -0x2c);
      *(uint *)(plain_text + 3) = (uint)plain_text[3] ^ (uint)plain_text[-5];
      *(uint *)((long)plain_text + 0x1c) =
           *(uint *)((long)plain_text + 0x1c) ^ *(uint *)((long)plain_text + -0x24);
      *(uint *)(plain_text + 4) = (uint)plain_text[4] ^ (uint)plain_text[-4];
      *(uint *)((long)plain_text + 0x24) =
           *(uint *)((long)plain_text + 0x24) ^ *(uint *)((long)plain_text + -0x1c);
      *(uint *)(plain_text + 5) = (uint)plain_text[5] ^ (uint)plain_text[-3];
      *(uint *)((long)plain_text + 0x2c) =
           *(uint *)((long)plain_text + 0x2c) ^ *(uint *)((long)plain_text + -0x14);
      *(uint *)(plain_text + 6) = (uint)plain_text[6] ^ (uint)plain_text[-2];
      *(uint *)((long)plain_text + 0x34) =
           *(uint *)((long)plain_text + 0x34) ^ *(uint *)((long)plain_text + -0xc);
      *(uint *)(plain_text + 7) = (uint)plain_text[7] ^ (uint)plain_text[-1];
      *(uint *)((long)plain_text + 0x3c) =
           *(uint *)((long)plain_text + 0x3c) ^ *(uint *)((long)plain_text + -4);
    }
    threefishEncryptBlockWords(key,plain_text,plain_text);
    plain_text = plain_text + 8;
  }
  return;
}

Assistant:

void cbc512Encrypt(ThreefishKey_t* key,
                   const uint64_t* iv,
                   uint64_t* plain_text,
                   const uint64_t num_blocks)
{
    //xor the initialization vector with the first block of input
    plain_text[0] ^= iv[0]; plain_text[1] ^= iv[1];
    plain_text[2] ^= iv[2]; plain_text[3] ^= iv[3];
    plain_text[4] ^= iv[4]; plain_text[5] ^= iv[5];
    plain_text[6] ^= iv[6]; plain_text[7] ^= iv[7];

    //run each block through the cipher chaining on the previous block
    for(uint64_t block=0; block<(num_blocks*SECURE_SLICE); block+=SECURE_SLICE)
    {
        //feedback the previous block into the next block by xoring them together
        if(block > 0)
        {
            const uint64_t offset = block-SECURE_SLICE;
            plain_text[block] ^= plain_text[offset];
            plain_text[block+1] ^= plain_text[offset+1];
            plain_text[block+2] ^= plain_text[offset+2];
            plain_text[block+3] ^= plain_text[offset+3];
            plain_text[block+4] ^= plain_text[offset+4];
            plain_text[block+5] ^= plain_text[offset+5];
            plain_text[block+6] ^= plain_text[offset+6];
            plain_text[block+7] ^= plain_text[offset+7];
        }
        //run the current block through the cipher
        threefishEncryptBlockWords(key, &plain_text[block], &plain_text[block]);
    }
}